

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_deserialize_field
          (t_cpp_generator *this,ostream *out,t_field *tfield,string *prefix,string *suffix)

{
  t_struct *ptVar1;
  t_field *ptVar2;
  bool pointer;
  uint uVar3;
  t_type *type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string *psVar5;
  ostream *poVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [12];
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  allocator local_179;
  string local_178;
  undefined1 local_158 [8];
  string t;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  t_base local_ec;
  undefined1 local_e8 [4];
  t_base tbase;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  t_struct *local_38;
  t_type *type;
  string *suffix_local;
  string *prefix_local;
  t_field *tfield_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  type = (t_type *)suffix;
  suffix_local = prefix;
  prefix_local = (string *)tfield;
  tfield_local = (t_field *)out;
  out_local = (ostream *)this;
  type_00 = t_field::get_type(tfield);
  local_38 = (t_struct *)t_generator::get_true_type(type_00);
  uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[4])();
  if ((uVar3 & 1) == 0) {
    psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
    std::operator+(&local_a8,prefix,psVar5);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   &local_a8,suffix);
    std::__cxx11::string::~string((string *)&local_a8);
    uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[0xb])();
    if (((uVar3 & 1) == 0) &&
       (uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar3 & 1) == 0)) {
      uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[0xd])();
      ptVar2 = tfield_local;
      ptVar1 = local_38;
      if ((uVar3 & 1) == 0) {
        uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[5])();
        if ((uVar3 & 1) == 0) {
          uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[10])();
          if ((uVar3 & 1) == 0) {
            t_field::get_name_abi_cxx11_((t_field *)prefix_local);
            uVar7 = std::__cxx11::string::c_str();
            type_name_abi_cxx11_(&local_220,this,&local_38->super_t_type,false,false);
            uVar8 = std::__cxx11::string::c_str();
            printf("DO NOT KNOW HOW TO DESERIALIZE FIELD \'%s\' TYPE \'%s\'\n",uVar7,uVar8);
            std::__cxx11::string::~string((string *)&local_220);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_178,"ecast",&local_179);
            t_generator::tmp((string *)local_158,(t_generator *)this,&local_178);
            std::__cxx11::string::~string((string *)&local_178);
            std::allocator<char>::~allocator((allocator<char> *)&local_179);
            ptVar2 = tfield_local;
            t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
            poVar6 = std::operator<<((ostream *)ptVar2,(string *)&local_1a0);
            poVar6 = std::operator<<(poVar6,"int32_t ");
            poVar6 = std::operator<<(poVar6,(string *)local_158);
            poVar6 = std::operator<<(poVar6,";");
            poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
            t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
            poVar6 = std::operator<<(poVar6,(string *)&local_1c0);
            poVar6 = std::operator<<(poVar6,"xfer += iprot->readI32(");
            poVar6 = std::operator<<(poVar6,(string *)local_158);
            poVar6 = std::operator<<(poVar6,");");
            poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
            t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
            poVar6 = std::operator<<(poVar6,(string *)&local_1e0);
            poVar6 = std::operator<<(poVar6,(string *)local_88);
            poVar6 = std::operator<<(poVar6," = static_cast<");
            type_name_abi_cxx11_(&local_200,this,&local_38->super_t_type,false,false);
            poVar6 = std::operator<<(poVar6,(string *)&local_200);
            poVar6 = std::operator<<(poVar6,">(");
            poVar6 = std::operator<<(poVar6,(string *)local_158);
            poVar6 = std::operator<<(poVar6,");");
            std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)&local_200);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::__cxx11::string::~string((string *)&local_1c0);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)local_158);
          }
        }
        else {
          poVar6 = t_generator::indent((t_generator *)this,(ostream *)tfield_local);
          std::operator<<(poVar6,"xfer += iprot->");
          local_ec = t_base_type::get_base((t_base_type *)local_38);
          switch(local_ec) {
          case TYPE_VOID:
            pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __cxa_allocate_exception(0x20);
            std::operator+(pbVar4,"compiler error: cannot serialize void field in a struct: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88);
            __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          case TYPE_STRING:
            uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[7])();
            if ((uVar3 & 1) == 0) {
              poVar6 = std::operator<<((ostream *)tfield_local,"readString(");
              poVar6 = std::operator<<(poVar6,(string *)local_88);
              std::operator<<(poVar6,");");
            }
            else {
              poVar6 = std::operator<<((ostream *)tfield_local,"readBinary(");
              poVar6 = std::operator<<(poVar6,(string *)local_88);
              std::operator<<(poVar6,");");
            }
            break;
          case TYPE_BOOL:
            poVar6 = std::operator<<((ostream *)tfield_local,"readBool(");
            poVar6 = std::operator<<(poVar6,(string *)local_88);
            std::operator<<(poVar6,");");
            break;
          case TYPE_I8:
            poVar6 = std::operator<<((ostream *)tfield_local,"readByte(");
            poVar6 = std::operator<<(poVar6,(string *)local_88);
            std::operator<<(poVar6,");");
            break;
          case TYPE_I16:
            poVar6 = std::operator<<((ostream *)tfield_local,"readI16(");
            poVar6 = std::operator<<(poVar6,(string *)local_88);
            std::operator<<(poVar6,");");
            break;
          case TYPE_I32:
            poVar6 = std::operator<<((ostream *)tfield_local,"readI32(");
            poVar6 = std::operator<<(poVar6,(string *)local_88);
            std::operator<<(poVar6,");");
            break;
          case TYPE_I64:
            poVar6 = std::operator<<((ostream *)tfield_local,"readI64(");
            poVar6 = std::operator<<(poVar6,(string *)local_88);
            std::operator<<(poVar6,");");
            break;
          case TYPE_DOUBLE:
            poVar6 = std::operator<<((ostream *)tfield_local,"readDouble(");
            poVar6 = std::operator<<(poVar6,(string *)local_88);
            std::operator<<(poVar6,");");
            break;
          default:
            t.field_2._M_local_buf[0xf] = '\x01';
            auVar9 = __cxa_allocate_exception(0x20);
            t_base_type::t_base_name_abi_cxx11_
                      (&local_130,(t_base_type *)(ulong)local_ec,auVar9._8_4_);
            std::operator+(&local_110,"compiler error: no C++ reader for base type ",&local_130);
            std::operator+(auVar9._0_8_,&local_110,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88);
            t.field_2._M_local_buf[0xf] = '\0';
            __cxa_throw(auVar9._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          std::operator<<((ostream *)tfield_local,(string *)&::endl_abi_cxx11_);
        }
      }
      else {
        std::__cxx11::string::string((string *)local_e8,(string *)local_88);
        generate_deserialize_container
                  (this,(ostream *)ptVar2,&ptVar1->super_t_type,(string *)local_e8);
        std::__cxx11::string::~string((string *)local_e8);
      }
    }
    else {
      ptVar2 = tfield_local;
      ptVar1 = local_38;
      std::__cxx11::string::string((string *)&local_c8,(string *)local_88);
      pointer = is_reference(this,(t_field *)prefix_local);
      generate_deserialize_struct(this,(ostream *)ptVar2,ptVar1,&local_c8,pointer);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    std::__cxx11::string::~string((string *)local_88);
    return;
  }
  name.field_2._M_local_buf[0xb] = '\x01';
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
  std::operator+(&local_58,"CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: ",prefix);
  psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
  std::operator+(pbVar4,&local_58,psVar5);
  name.field_2._M_local_buf[0xb] = '\0';
  __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void t_cpp_generator::generate_deserialize_field(ostream& out,
                                                 t_field* tfield,
                                                 string prefix,
                                                 string suffix) {
  t_type* type = get_true_type(tfield->get_type());

  if (type->is_void()) {
    throw "CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  string name = prefix + tfield->get_name() + suffix;

  if (type->is_struct() || type->is_xception()) {
    generate_deserialize_struct(out, (t_struct*)type, name, is_reference(tfield));
  } else if (type->is_container()) {
    generate_deserialize_container(out, type, name);
  } else if (type->is_base_type()) {
    indent(out) << "xfer += iprot->";
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "compiler error: cannot serialize void field in a struct: " + name;
      break;
    case t_base_type::TYPE_STRING:
      if (type->is_binary()) {
        out << "readBinary(" << name << ");";
      } else {
        out << "readString(" << name << ");";
      }
      break;
    case t_base_type::TYPE_BOOL:
      out << "readBool(" << name << ");";
      break;
    case t_base_type::TYPE_I8:
      out << "readByte(" << name << ");";
      break;
    case t_base_type::TYPE_I16:
      out << "readI16(" << name << ");";
      break;
    case t_base_type::TYPE_I32:
      out << "readI32(" << name << ");";
      break;
    case t_base_type::TYPE_I64:
      out << "readI64(" << name << ");";
      break;
    case t_base_type::TYPE_DOUBLE:
      out << "readDouble(" << name << ");";
      break;
    default:
      throw "compiler error: no C++ reader for base type " + t_base_type::t_base_name(tbase) + name;
    }
    out << endl;
  } else if (type->is_enum()) {
    string t = tmp("ecast");
    out << indent() << "int32_t " << t << ";" << endl << indent() << "xfer += iprot->readI32(" << t
        << ");" << endl << indent() << name << " = static_cast<" 
        << type_name(type) << ">(" << t << ");" << endl;
  } else {
    printf("DO NOT KNOW HOW TO DESERIALIZE FIELD '%s' TYPE '%s'\n",
           tfield->get_name().c_str(),
           type_name(type).c_str());
  }
}